

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::lts_20250127::Mutex::Lock(Mutex *this)

{
  ulong uVar1;
  GraphId id;
  int iVar2;
  bool bVar3;
  
  id = DebugOnlyDeadlockCheck(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
    }
    UNLOCK();
    if (bVar3) goto LAB_002648d2;
  }
  iVar2 = DAT_00440bc4 + 1;
  do {
    uVar1 = (this->mu_).super___atomic_base<long>._M_i;
    if ((uVar1 & 0x11) != 0) break;
    if ((uVar1 & 8) == 0) {
      LOCK();
      bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar3) {
        (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
      }
      UNLOCK();
      if (bVar3) goto LAB_002648d2;
    }
    iVar2 = iVar2 + -1;
  } while (1 < iVar2);
  LockSlow(this,(MuHow)kExclusiveS,(Condition *)0x0,0);
LAB_002648d2:
  DebugOnlyLockEnter(this,id);
  return;
}

Assistant:

void Mutex::Lock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, 0);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // try fast acquire, then spin loop
  if (ABSL_PREDICT_FALSE((v & (kMuWriter | kMuReader | kMuEvent)) != 0) ||
      ABSL_PREDICT_FALSE(!mu_.compare_exchange_strong(
          v, kMuWriter | v, std::memory_order_acquire,
          std::memory_order_relaxed))) {
    // try spin acquire, then slow loop
    if (ABSL_PREDICT_FALSE(!TryAcquireWithSpinning(&this->mu_))) {
      this->LockSlow(kExclusive, nullptr, 0);
    }
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, 0, 0);
}